

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

X86CPU * cpu_x86_init_x86_64(uc_struct_conflict *uc)

{
  byte *pbVar1;
  uint *puVar2;
  long *plVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  TranslationBlock **ppTVar6;
  TranslationBlock **ppTVar7;
  _Bool _Var8;
  X86CPUDefinition *pXVar9;
  CPUCaches *pCVar10;
  ulong uVar11;
  ulong uVar12;
  TranslationBlock *pTVar13;
  CPUCacheInfo *pCVar14;
  CPUCacheInfo *pCVar15;
  CPUCacheInfo *pCVar16;
  CPUCacheInfo *pCVar17;
  uint uVar18;
  uint32_t uVar19;
  X86CPU *cpu_00;
  X86CPUModel *pXVar20;
  size_t sVar21;
  uint64_t uVar22;
  uint64_t *puVar23;
  uint32_t *puVar24;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  X86CPU *cpu;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  char *pcVar31;
  
  cpu_00 = (X86CPU *)calloc(1,0xa7c0);
  if (cpu_00 == (X86CPU *)0x0) {
    return (X86CPU *)0x0;
  }
  if (uc->cpu_model == 0x7fffffff) {
    uc->cpu_model = 0;
  }
  else if (0x25 < (uint)uc->cpu_model) goto LAB_00506c11;
  (cpu_00->parent_obj).cc = &(cpu_00->cc).parent_class;
  (cpu_00->parent_obj).uc = (uc_struct_conflict7 *)uc;
  uc->cpu = (CPUState *)cpu_00;
  (cpu_00->env).cpuid_level_func7 = 0xffffffff;
  (cpu_00->env).cpuid_level = 0xffffffff;
  (cpu_00->env).cpuid_xlevel = 0xffffffff;
  (cpu_00->env).cpuid_xlevel2 = 0xffffffff;
  cpu_class_init((uc_struct *)uc,&(cpu_00->cc).parent_class);
  (cpu_00->cc).parent_reset = (_func_void_CPUState_ptr *)(cpu_00->cc).parent_class.reset;
  (cpu_00->cc).parent_class.reset = x86_cpu_reset;
  (cpu_00->cc).parent_class.has_work = x86_cpu_has_work;
  (cpu_00->cc).parent_class.do_interrupt = x86_cpu_do_interrupt_x86_64;
  (cpu_00->cc).parent_class.cpu_exec_interrupt = x86_cpu_exec_interrupt_x86_64;
  (cpu_00->cc).parent_class.set_pc = x86_cpu_set_pc;
  (cpu_00->cc).parent_class.synchronize_from_tb = x86_cpu_synchronize_from_tb;
  (cpu_00->cc).parent_class.get_arch_id = x86_cpu_get_arch_id;
  (cpu_00->cc).parent_class.get_paging_enabled = x86_cpu_get_paging_enabled;
  (cpu_00->cc).parent_class.asidx_from_attrs = x86_asidx_from_attrs;
  (cpu_00->cc).parent_class.get_memory_mapping = x86_cpu_get_memory_mapping_x86_64;
  (cpu_00->cc).parent_class.get_phys_page_attrs_debug = x86_cpu_get_phys_page_attrs_debug_x86_64;
  (cpu_00->cc).parent_class.debug_excp_handler = breakpoint_handler_x86_64;
  (cpu_00->cc).parent_class.cpu_exec_enter = x86_cpu_exec_enter_x86_64;
  (cpu_00->cc).parent_class.cpu_exec_exit = x86_cpu_exec_exit_x86_64;
  (cpu_00->cc).parent_class.tcg_initialize = tcg_x86_init_x86_64;
  (cpu_00->cc).parent_class.tlb_fill_cpu = x86_cpu_tlb_fill_x86_64;
  pXVar20 = (X86CPUModel *)calloc(1,0x20);
  (cpu_00->cc).model = pXVar20;
  if (pXVar20 == (X86CPUModel *)0x0) {
LAB_00506c11:
    free(cpu_00);
    return (X86CPU *)0x0;
  }
  pXVar20->version = -2;
  pXVar20->cpudef = builtin_x86_defs + uc->cpu_model;
  cpu_common_initfn((uc_struct *)uc,(CPUState *)cpu_00);
  (cpu_00->env).nr_dies = 1;
  (cpu_00->env).nr_nodes = 1;
  (cpu_00->parent_obj).env_ptr = &cpu_00->env;
  (cpu_00->parent_obj).icount_decr_ptr = &(cpu_00->neg).icount_decr;
  (cpu_00->env).uc = uc;
  pXVar20 = (cpu_00->cc).model;
  if (pXVar20 != (X86CPUModel *)0x0) {
    pXVar9 = pXVar20->cpudef;
    (cpu_00->env).cpuid_min_level = pXVar9->level;
    (cpu_00->env).cpuid_xlevel = pXVar9->xlevel;
    uVar18 = pXVar9->family;
    if (uVar18 < 0x10f) {
      uVar26 = uVar18 * 0x100000 - 0xeff100;
      if (uVar18 < 0x10) {
        uVar26 = uVar18 << 8;
      }
      (cpu_00->env).cpuid_version = uVar26 | (cpu_00->env).cpuid_version & 0xf00ff0ff;
    }
    uVar18 = pXVar9->model;
    if (uVar18 < 0x100) {
      (cpu_00->env).cpuid_version =
           (uVar18 & 0xf0) << 0xc | (uVar18 & 0xf) << 4 | (cpu_00->env).cpuid_version & 0xfff0ff0f;
    }
    if ((uint)pXVar9->stepping < 0x10) {
      (cpu_00->env).cpuid_version = (cpu_00->env).cpuid_version & 0xfffffff0 | pXVar9->stepping;
    }
    pcVar31 = "";
    if (pXVar9->model_id != (char *)0x0) {
      pcVar31 = pXVar9->model_id;
    }
    sVar21 = strlen(pcVar31);
    (cpu_00->env).cpuid_model[0] = 0;
    (cpu_00->env).cpuid_model[1] = 0;
    (cpu_00->env).cpuid_model[2] = 0;
    (cpu_00->env).cpuid_model[3] = 0;
    (cpu_00->env).cpuid_model[4] = 0;
    (cpu_00->env).cpuid_model[5] = 0;
    (cpu_00->env).cpuid_model[6] = 0;
    (cpu_00->env).cpuid_model[7] = 0;
    (cpu_00->env).cpuid_model[8] = 0;
    (cpu_00->env).cpuid_model[9] = 0;
    (cpu_00->env).cpuid_model[10] = 0;
    (cpu_00->env).cpuid_model[0xb] = 0;
    bVar25 = 0;
    lVar29 = 0;
    do {
      uVar18 = 0;
      if (lVar29 < (int)sVar21) {
        uVar18 = (uint)(byte)pcVar31[lVar29];
      }
      puVar2 = (uint *)((long)(cpu_00->env).cpuid_model + (ulong)((uint)lVar29 & 0xfffffffc));
      *puVar2 = *puVar2 | uVar18 << (bVar25 & 0x18);
      lVar29 = lVar29 + 1;
      bVar25 = bVar25 + 8;
    } while (lVar29 != 0x30);
    lVar29 = 0;
    do {
      (cpu_00->env).features[lVar29] = pXVar9->features[lVar29];
      lVar29 = lVar29 + 1;
    } while (lVar29 != 0x22);
    cpu_00->legacy_cache = pXVar9->cache_info == (CPUCaches *)0x0;
    pbVar1 = (byte *)((long)(cpu_00->env).features + 0xb);
    *pbVar1 = *pbVar1 | 0x80;
    sVar21 = strlen(pXVar9->vendor);
    if (sVar21 == 0xc) {
      (cpu_00->env).cpuid_vendor1 = 0;
      (cpu_00->env).cpuid_vendor2 = 0;
      (cpu_00->env).cpuid_vendor3 = 0;
      pcVar31 = pXVar9->vendor + 8;
      lVar29 = 0;
      uVar18 = 0;
      uVar26 = 0;
      uVar28 = 0;
      do {
        bVar25 = (byte)lVar29;
        uVar18 = uVar18 | (uint)(byte)pcVar31[-8] << (bVar25 & 0x1f);
        (cpu_00->env).cpuid_vendor1 = uVar18;
        uVar26 = uVar26 | (uint)(byte)pcVar31[-4] << (bVar25 & 0x1f);
        (cpu_00->env).cpuid_vendor2 = uVar26;
        uVar28 = uVar28 | (uint)(byte)*pcVar31 << (bVar25 & 0x1f);
        (cpu_00->env).cpuid_vendor3 = uVar28;
        lVar29 = lVar29 + 8;
        pcVar31 = pcVar31 + 1;
      } while (lVar29 != 0x20);
    }
  }
  if (cpu_00->ucode_rev == 0) {
    if ((((cpu_00->env).cpuid_vendor1 != 0x68747541) || ((cpu_00->env).cpuid_vendor2 != 0x69746e65))
       || (uVar22 = 0x1000065, (cpu_00->env).cpuid_vendor3 != 0x444d4163)) {
      uVar22 = 0x100000000;
    }
    cpu_00->ucode_rev = uVar22;
  }
  puVar24 = &(cpu_00->mwait).ecx;
  *(byte *)puVar24 = (byte)*puVar24 | 3;
  if (cpu_00->apic_id == 0xffffffff) goto LAB_00506da2;
  if (cpu_00->max_features == true) {
    puVar23 = &feature_word_info[1].no_autoenable_flags;
    lVar29 = -0x22;
    do {
      uVar27 = puVar23[-1];
      puVar4 = (cpu_00->env).user_features + lVar29;
      uVar11 = puVar4[1];
      puVar24 = (cpu_00->env).cpuid_model + lVar29 * 2;
      uVar12 = *(ulong *)(puVar24 + 2);
      uVar30 = *puVar23;
      puVar5 = (cpu_00->env).user_features + lVar29;
      *puVar5 = ~(puVar23[-0x45] | *(ulong *)puVar24) & puVar23[-0x46] | *puVar4;
      puVar5[1] = ~(uVar30 | uVar12) & uVar27 | uVar11;
      puVar23 = puVar23 + 0x8a;
      lVar29 = lVar29 + 2;
    } while (lVar29 != 0);
  }
  (cpu_00->env).features[0xb] = 0;
  if ((*(byte *)((long)(cpu_00->env).features + 0xb) & 4) != 0) {
    puVar24 = &x86_ext_save_areas[0].bits;
    lVar29 = 0;
    uVar27 = 0;
    do {
      uVar30 = 0;
      if ((*puVar24 & (uint)(cpu_00->env).features[((ExtSaveArea *)(puVar24 + -1))->feature]) != 0)
      {
        uVar30 = 1L << ((byte)lVar29 & 0x3f);
      }
      uVar27 = uVar27 | uVar30;
      lVar29 = lVar29 + 1;
      puVar24 = puVar24 + 4;
    } while (lVar29 != 10);
    (cpu_00->env).features[0x15] = uVar27;
    (cpu_00->env).features[0x16] = uVar27 >> 0x20;
  }
  x86_cpu_adjust_feat_level(cpu_00,FEAT_7_0_EBX);
  if (cpu_00->full_cpuid_auto_level == true) {
    x86_cpu_adjust_feat_level(cpu_00,FEAT_1_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_1_ECX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_6_EAX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_7_0_ECX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_7_1_EAX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0001_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0001_ECX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0007_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_8000_0008_EBX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_C000_0001_EDX);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_SVM);
    x86_cpu_adjust_feat_level(cpu_00,FEAT_XSAVE);
    if ((((*(byte *)((long)(cpu_00->env).features + 0x13) & 2) != 0) &&
        (cpu_00->intel_pt_auto_level == true)) && ((cpu_00->env).cpuid_min_level < 0x14)) {
      (cpu_00->env).cpuid_min_level = 0x14;
    }
    if ((1 < (cpu_00->env).nr_dies) && ((cpu_00->env).cpuid_min_level < 0x1f)) {
      (cpu_00->env).cpuid_min_level = 0x1f;
    }
    if ((((cpu_00->env).features[7] & 4) != 0) && ((cpu_00->env).cpuid_min_xlevel < 0x8000000a)) {
      (cpu_00->env).cpuid_min_xlevel = 0x8000000a;
    }
  }
  if ((cpu_00->env).cpuid_level_func7 == 0xffffffff) {
    (cpu_00->env).cpuid_level_func7 = (cpu_00->env).cpuid_min_level_func7;
  }
  if ((cpu_00->env).cpuid_level == 0xffffffff) {
    (cpu_00->env).cpuid_level = (cpu_00->env).cpuid_min_level;
  }
  if ((cpu_00->env).cpuid_xlevel == 0xffffffff) {
    (cpu_00->env).cpuid_xlevel = (cpu_00->env).cpuid_min_xlevel;
  }
  if ((cpu_00->env).cpuid_xlevel2 == 0xffffffff) {
    (cpu_00->env).cpuid_xlevel2 = (cpu_00->env).cpuid_min_xlevel2;
  }
  _Var8 = cpu_00->force_features;
  puVar23 = &feature_word_info[0].tcg_features;
  lVar29 = 0x1406;
  do {
    uVar27 = *puVar23;
    uVar30 = puVar23[0x45];
    plVar3 = (cpu_00->parent_obj).jmp_env[0].__jmpbuf + lVar29 + -8;
    uVar11 = *plVar3;
    uVar12 = plVar3[1];
    if (_Var8 == false) {
      (cpu_00->parent_obj).jmp_env[0].__jmpbuf[lVar29 + -8] = uVar11 & uVar27;
      (cpu_00->parent_obj).jmp_env[0].__jmpbuf[lVar29 + -7] = uVar12 & uVar30;
    }
    ppTVar6 = (cpu_00->parent_obj).tb_jmp_cache + lVar29 + 0x8a;
    pTVar13 = ppTVar6[1];
    ppTVar7 = (cpu_00->parent_obj).tb_jmp_cache + lVar29 + 0x8a;
    *ppTVar7 = (TranslationBlock *)((ulong)*ppTVar6 | ~uVar27 & uVar11);
    ppTVar7[1] = (TranslationBlock *)((ulong)pTVar13 | ~uVar30 & uVar12);
    puVar23 = puVar23 + 0x8a;
    lVar29 = lVar29 + 2;
  } while (lVar29 != 0x1428);
  if (cpu_00->enforce_cpuid == true) {
    if (cpu_00->filtered_features[0] != 0) goto LAB_00506da2;
    uVar27 = 0;
    do {
      uVar30 = uVar27;
      if (uVar30 == 0x21) goto LAB_00506b9d;
      uVar27 = uVar30 + 1;
    } while (cpu_00->filtered_features[uVar30 + 1] == 0);
    if (uVar30 < 0x21) goto LAB_00506da2;
  }
LAB_00506b9d:
  if ((((cpu_00->env).cpuid_vendor1 == 0x68747541) && ((cpu_00->env).cpuid_vendor2 == 0x69746e65))
     && ((cpu_00->env).cpuid_vendor3 == 0x444d4163)) {
    (cpu_00->env).features[6] =
         (ulong)((uint)(cpu_00->env).features[0] & 0x183f3ff |
                (uint)(cpu_00->env).features[6] & 0xfe7c0c00);
  }
  uVar19 = cpu_00->phys_bits;
  if ((*(byte *)((long)(cpu_00->env).features + 0x33) & 0x20) == 0) {
    if (uVar19 != 0) goto LAB_00506da2;
    uVar19 = (uint)((*(byte *)((long)(cpu_00->env).features + 2) & 2) >> 1) * 4 + 0x20;
LAB_00506c33:
    cpu_00->phys_bits = uVar19;
  }
  else {
    if (uVar19 == 0) {
      uVar19 = 0x28;
      goto LAB_00506c33;
    }
    if (uVar19 != 0x28) goto LAB_00506da2;
  }
  if (cpu_00->legacy_cache == false) {
    pXVar20 = (cpu_00->cc).model;
    if ((pXVar20 == (X86CPUModel *)0x0) ||
       (pCVar10 = pXVar20->cpudef->cache_info, pCVar10 == (CPUCaches *)0x0)) goto LAB_00506da2;
    pCVar14 = pCVar10->l1d_cache;
    pCVar15 = pCVar10->l1i_cache;
    pCVar16 = pCVar10->l3_cache;
    (cpu_00->env).cache_info_amd.l2_cache = pCVar10->l2_cache;
    (cpu_00->env).cache_info_amd.l3_cache = pCVar16;
    (cpu_00->env).cache_info_amd.l1d_cache = pCVar14;
    (cpu_00->env).cache_info_amd.l1i_cache = pCVar15;
    pCVar14 = pCVar10->l1d_cache;
    pCVar15 = pCVar10->l1i_cache;
    pCVar16 = pCVar10->l2_cache;
    pCVar17 = pCVar10->l3_cache;
    (cpu_00->env).cache_info_cpuid4.l2_cache = pCVar16;
    (cpu_00->env).cache_info_cpuid4.l3_cache = pCVar17;
    (cpu_00->env).cache_info_cpuid4.l1d_cache = pCVar14;
    (cpu_00->env).cache_info_cpuid4.l1i_cache = pCVar15;
    (cpu_00->env).cache_info_cpuid2.l1d_cache = pCVar14;
    (cpu_00->env).cache_info_cpuid2.l1i_cache = pCVar15;
    (cpu_00->env).cache_info_cpuid2.l2_cache = pCVar16;
    (cpu_00->env).cache_info_cpuid2.l3_cache = pCVar17;
  }
  else {
    (cpu_00->env).cache_info_cpuid2.l1d_cache = &legacy_l1d_cache;
    (cpu_00->env).cache_info_cpuid2.l1i_cache = &legacy_l1i_cache;
    (cpu_00->env).cache_info_cpuid2.l2_cache = &legacy_l2_cache_cpuid2;
    (cpu_00->env).cache_info_cpuid2.l3_cache = &legacy_l3_cache;
    (cpu_00->env).cache_info_cpuid4.l1d_cache = &legacy_l1d_cache;
    (cpu_00->env).cache_info_cpuid4.l1i_cache = &legacy_l1i_cache;
    (cpu_00->env).cache_info_cpuid4.l2_cache = &legacy_l2_cache;
    (cpu_00->env).cache_info_cpuid4.l3_cache = &legacy_l3_cache;
    (cpu_00->env).cache_info_amd.l1d_cache = &legacy_l1d_cache_amd;
    (cpu_00->env).cache_info_amd.l1i_cache = &legacy_l1i_cache_amd;
    (cpu_00->env).cache_info_amd.l2_cache = &legacy_l2_cache_amd;
    (cpu_00->env).cache_info_amd.l3_cache = &legacy_l3_cache;
  }
  cpu_exec_realizefn_x86_64((CPUState *)cpu_00);
  if ((0x500 < ((cpu_00->env).cpuid_version & 0xe00)) &&
     ((~(uint)(cpu_00->env).features[0] & 0x4080) == 0)) {
    (cpu_00->env).mcg_cap = (ulong)((uint)cpu_00->enable_lmce << 0x1b) | 0x100010a;
    (cpu_00->env).mcg_ctl = 0xffffffffffffffff;
    lVar29 = 0;
    do {
      *(undefined8 *)((long)(cpu_00->env).mce_banks + lVar29) = 0xffffffffffffffff;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x140);
  }
  cpu_reset((CPUState *)cpu_00);
LAB_00506da2:
  cpu_address_space_init_x86_64((CPUState *)cpu_00,0,(cpu_00->parent_obj).memory);
  qemu_init_vcpu_x86_64((CPUState *)cpu_00);
  return cpu_00;
}

Assistant:

X86CPU *cpu_x86_init(struct uc_struct *uc)
{
    X86CPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    X86CPUClass *xcc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
#ifdef TARGET_X86_64
        uc->cpu_model = UC_CPU_X86_QEMU64; // qemu64
#else
        uc->cpu_model = UC_CPU_X86_QEMU32; // qemu32
#endif
    } else if (uc->cpu_model >= ARRAY_SIZE(builtin_x86_defs)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;
    cpu->env.cpuid_level_func7 = UINT32_MAX;
    cpu->env.cpuid_level = UINT32_MAX;
    cpu->env.cpuid_xlevel = UINT32_MAX;
    cpu->env.cpuid_xlevel2 = UINT32_MAX;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init X86CPUClass */
    x86_cpu_common_class_init(uc, cc, NULL);

    /* init X86CPUModel */
    /* Ignore X86CPUVersion, X86CPUVersionDefinition.
       we do not need so many cpu types and their property.
       version: more typename. x86_cpu_versioned_model_name().
       alias: more property. */
    xcc = &cpu->cc;
    xcc->model = calloc(1, sizeof(*(xcc->model)));
    if (xcc->model == NULL) {
        free(cpu);
        return NULL;
    }

    xcc->model->version = CPU_VERSION_AUTO;
    xcc->model->cpudef = &builtin_x86_defs[uc->cpu_model];

    if (xcc->model->cpudef == NULL) {
        free(xcc->model);
        free(cpu);
        return NULL;
    }

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init X86CPU */
    x86_cpu_initfn(uc, cs);

    /* realize X86CPU */
    x86_cpu_realizefn(uc, cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    /* realize CPUState */

    return cpu;
}